

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_tcp_ref(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t h;
  uv_stream_t uStack_2d0;
  uv_loop_t *puStack_1f8;
  long lStack_1e8;
  long lStack_1e0;
  uv_stream_t uStack_1d8;
  uv_loop_t *puStack_100;
  long local_f0;
  long local_e8;
  uv_tcp_t local_e0;
  
  puStack_100 = (uv_loop_t *)0x1b58a0;
  puVar2 = uv_default_loop();
  puStack_100 = (uv_loop_t *)0x1b58b0;
  uv_tcp_init(puVar2,&local_e0);
  puStack_100 = (uv_loop_t *)0x1b58b8;
  uv_unref((uv_handle_t *)&local_e0);
  puStack_100 = (uv_loop_t *)0x1b58bd;
  puVar2 = uv_default_loop();
  puStack_100 = (uv_loop_t *)0x1b58c7;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_100 = (uv_loop_t *)0x1b58cf;
  do_close(&local_e0);
  puStack_100 = (uv_loop_t *)0x1b58d4;
  puVar2 = uv_default_loop();
  puStack_100 = (uv_loop_t *)0x1b58e8;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_100 = (uv_loop_t *)0x1b58f2;
  uv_run(puVar2,UV_RUN_DEFAULT);
  local_e8 = 0;
  puStack_100 = (uv_loop_t *)0x1b5900;
  puVar3 = uv_default_loop();
  puStack_100 = (uv_loop_t *)0x1b5908;
  iVar1 = uv_loop_close(puVar3);
  local_f0 = (long)iVar1;
  if (local_e8 == local_f0) {
    puStack_100 = (uv_loop_t *)0x1b5920;
    uv_library_shutdown();
    return 0;
  }
  puStack_100 = (uv_loop_t *)run_test_tcp_ref2;
  run_test_tcp_ref_cold_1();
  puStack_1f8 = (uv_loop_t *)0x1b5947;
  puStack_100 = puVar2;
  puVar2 = uv_default_loop();
  puStack_1f8 = (uv_loop_t *)0x1b5957;
  uv_tcp_init(puVar2,(uv_tcp_t *)&uStack_1d8);
  puStack_1f8 = (uv_loop_t *)0x1b596b;
  uv_listen(&uStack_1d8,0x80,fail_cb);
  puStack_1f8 = (uv_loop_t *)0x1b5973;
  uv_unref((uv_handle_t *)&uStack_1d8);
  puStack_1f8 = (uv_loop_t *)0x1b5978;
  puVar2 = uv_default_loop();
  puStack_1f8 = (uv_loop_t *)0x1b5982;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_1f8 = (uv_loop_t *)0x1b598a;
  do_close(&uStack_1d8);
  puStack_1f8 = (uv_loop_t *)0x1b598f;
  puVar2 = uv_default_loop();
  puStack_1f8 = (uv_loop_t *)0x1b59a3;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_1f8 = (uv_loop_t *)0x1b59ad;
  uv_run(puVar2,UV_RUN_DEFAULT);
  lStack_1e0 = 0;
  puStack_1f8 = (uv_loop_t *)0x1b59bb;
  puVar3 = uv_default_loop();
  puStack_1f8 = (uv_loop_t *)0x1b59c3;
  iVar1 = uv_loop_close(puVar3);
  lStack_1e8 = (long)iVar1;
  if (lStack_1e0 == lStack_1e8) {
    puStack_1f8 = (uv_loop_t *)0x1b59db;
    uv_library_shutdown();
    return 0;
  }
  puStack_1f8 = (uv_loop_t *)run_test_tcp_ref2b;
  run_test_tcp_ref2_cold_1();
  puStack_1f8 = puVar2;
  puVar2 = uv_default_loop();
  uv_tcp_init(puVar2,(uv_tcp_t *)&uStack_2d0);
  uv_listen(&uStack_2d0,0x80,fail_cb);
  uv_unref((uv_handle_t *)&uStack_2d0);
  uv_close((uv_handle_t *)&uStack_2d0,close_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called == 1) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_ref) {
  uv_tcp_t h;
  uv_tcp_init(uv_default_loop(), &h);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}